

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O3

bool __thiscall ON_BezierCurve::ReserveCVCapacity(ON_BezierCurve *this,int desired_capacity)

{
  double *pdVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->m_cv_capacity < desired_capacity) {
    if (this->m_cv == (double *)0x0) {
      pdVar1 = (double *)onmalloc((long)desired_capacity << 3);
    }
    else {
      if (this->m_cv_capacity < 1) {
        return false;
      }
      pdVar1 = (double *)onrealloc(this->m_cv,(long)desired_capacity << 3);
    }
    this->m_cv = pdVar1;
    bVar3 = pdVar1 != (double *)0x0;
    iVar2 = 0;
    if (bVar3) {
      iVar2 = desired_capacity;
    }
    this->m_cv_capacity = iVar2;
  }
  return bVar3;
}

Assistant:

bool ON_BezierCurve::ReserveCVCapacity( int desired_capacity )
{
	bool rc = false;
	if ( desired_capacity > m_cv_capacity ) {
		if ( !m_cv ) {
			m_cv = (double*)onmalloc(desired_capacity*sizeof(*m_cv));
			if ( !m_cv ) {
				m_cv_capacity = 0;
			}
			else {
				m_cv_capacity = desired_capacity;
				rc = true;
			}
		}
		else if ( m_cv_capacity > 0 ) {
			m_cv = (double*)onrealloc(m_cv,desired_capacity*sizeof(*m_cv));
			if ( !m_cv ) {
				m_cv_capacity = 0;
			}
			else {
				m_cv_capacity = desired_capacity;
				rc = true;
			}
		}
	} 
	else 
		rc =true;
	return rc;
}